

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__gif_test(stbi__context *s)

{
  stbi_uc sVar1;
  uint uVar2;
  
  sVar1 = stbi__get8(s);
  uVar2 = 0;
  if (sVar1 == 'G') {
    sVar1 = stbi__get8(s);
    if (sVar1 == 'I') {
      sVar1 = stbi__get8(s);
      if (sVar1 == 'F') {
        sVar1 = stbi__get8(s);
        uVar2 = 0;
        if (sVar1 == '8') {
          sVar1 = stbi__get8(s);
          if ((sVar1 == '9') || (sVar1 == '7')) {
            sVar1 = stbi__get8(s);
            uVar2 = (uint)(sVar1 == 'a');
          }
        }
      }
    }
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return uVar2;
}

Assistant:

static int stbi__gif_test(stbi__context *s)
{
   int r = stbi__gif_test_raw(s);
   stbi__rewind(s);
   return r;
}